

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

char * AArch64_AM_getShiftExtendName(AArch64_AM_ShiftExtendType ST)

{
  char *pcStack_10;
  AArch64_AM_ShiftExtendType ST_local;
  
  switch(ST) {
  case AArch64_AM_LSL:
    pcStack_10 = "lsl";
    break;
  case AArch64_AM_LSR:
    pcStack_10 = "lsr";
    break;
  case AArch64_AM_ASR:
    pcStack_10 = "asr";
    break;
  case AArch64_AM_ROR:
    pcStack_10 = "ror";
    break;
  case AArch64_AM_MSL:
    pcStack_10 = "msl";
    break;
  case AArch64_AM_UXTB:
    pcStack_10 = "uxtb";
    break;
  case AArch64_AM_UXTH:
    pcStack_10 = "uxth";
    break;
  case AArch64_AM_UXTW:
    pcStack_10 = "uxtw";
    break;
  case AArch64_AM_UXTX:
    pcStack_10 = "uxtx";
    break;
  case AArch64_AM_SXTB:
    pcStack_10 = "sxtb";
    break;
  case AArch64_AM_SXTH:
    pcStack_10 = "sxth";
    break;
  case AArch64_AM_SXTW:
    pcStack_10 = "sxtw";
    break;
  case AArch64_AM_SXTX:
    pcStack_10 = "sxtx";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static inline const char *AArch64_AM_getShiftExtendName(AArch64_AM_ShiftExtendType ST)
{
	switch (ST) {
		default: return NULL; // never reach
		case AArch64_AM_LSL: return "lsl";
		case AArch64_AM_LSR: return "lsr";
		case AArch64_AM_ASR: return "asr";
		case AArch64_AM_ROR: return "ror";
		case AArch64_AM_MSL: return "msl";
		case AArch64_AM_UXTB: return "uxtb";
		case AArch64_AM_UXTH: return "uxth";
		case AArch64_AM_UXTW: return "uxtw";
		case AArch64_AM_UXTX: return "uxtx";
		case AArch64_AM_SXTB: return "sxtb";
		case AArch64_AM_SXTH: return "sxth";
		case AArch64_AM_SXTW: return "sxtw";
		case AArch64_AM_SXTX: return "sxtx";
	}
}